

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int js_parse_skip_parens_token(JSParseState *s,int *pbits,BOOL no_line_terminator)

{
  JSToken *token;
  int iVar1;
  BOOL BVar2;
  JSAtom JVar3;
  uint8_t *puVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  char state [256];
  undefined4 local_13c;
  char local_138 [264];
  
  local_138[0] = '\0';
  iVar7 = s->last_line_num;
  iVar1 = (s->token).line_num;
  puVar4 = (s->token).ptr;
  BVar2 = s->got_lf;
  token = &s->token;
  iVar6 = 0;
  uVar10 = 1;
  uVar9 = 0;
  local_13c = no_line_terminator;
  do {
    iVar5 = token->val;
    if (iVar5 < 0x3b) {
      if (iVar5 < -0x56) {
        if (iVar5 == -0x7e) {
LAB_00154e8a:
          if ((s->token).u.str.sep != 0x60) {
            iVar5 = 0x60;
            goto LAB_00154e93;
          }
          goto LAB_00154eb5;
        }
        lVar8 = -2;
        if (iVar5 != -0x7a) {
          if (iVar5 != -0x5b) goto LAB_00154eb8;
          if (uVar10 == 2) {
            uVar9 = uVar9 | 2;
          }
          iVar6 = -0x5b;
          goto LAB_00154ee9;
        }
LAB_00154dbc:
        if (iVar6 < 0x29) {
          if ((0x32 < iVar6 + 0x80U) ||
             ((0x438000030001bU >> ((ulong)(iVar6 + 0x80U) & 0x3f) & 1) == 0)) {
LAB_00154f13:
            s->buf_ptr = s->buf_ptr + lVar8;
            iVar6 = js_parse_regexp(s);
            if (iVar6 != 0) goto LAB_00154f29;
          }
        }
        else if (((iVar6 != 0x29) && (iVar6 != 0x5d)) && (iVar6 != 0x7d)) goto LAB_00154f13;
LAB_00154eb5:
        iVar5 = token->val;
LAB_00154eb8:
        iVar6 = iVar5;
        if (((iVar6 == -0x7d) &&
            ((JVar3 = (s->token).u.ident.atom, JVar3 == 0x2d || (iVar6 = -0x7d, JVar3 == 0x43)))) &&
           (iVar6 = -0x7d, (s->token).u.ident.has_escape == 0)) {
          iVar6 = -0x27;
        }
        goto LAB_00154ee9;
      }
      if (iVar5 < 0x29) {
        if (iVar5 == 0x28) {
LAB_00154e93:
          if (uVar10 < 0x100) {
            local_138[uVar10] = (char)iVar5;
            uVar10 = uVar10 + 1;
            goto LAB_00154eb5;
          }
        }
        else if (iVar5 != -0x56) goto LAB_00154eb8;
      }
      else {
        if (iVar5 != 0x29) {
          if (iVar5 == 0x2f) {
            lVar8 = -1;
            goto LAB_00154dbc;
          }
          goto LAB_00154eb8;
        }
        if (local_138[uVar10 - 1] == '(') goto LAB_00154eb2;
      }
LAB_00154f29:
      uVar11 = 0xffffffaa;
      goto LAB_00154f8a;
    }
    if (0x5c < iVar5) {
      if (iVar5 == 0x5d) {
        if (local_138[uVar10 - 1] == '[') {
LAB_00154eb2:
          uVar10 = uVar10 - 1;
          goto LAB_00154eb5;
        }
      }
      else {
        if (iVar5 != 0x7d) {
          if (iVar5 == 0x7b) goto LAB_00154e93;
          goto LAB_00154eb8;
        }
        lVar8 = uVar10 - 1;
        uVar10 = uVar10 - 1;
        iVar6 = 0x7d;
        if (local_138[lVar8] == '{') goto LAB_00154ee9;
        if (local_138[lVar8] == '`') {
          free_token(s,token);
          s->got_lf = 0;
          s->last_line_num = (s->token).line_num;
          iVar6 = js_parse_template_part(s,s->buf_ptr);
          if (iVar6 == 0) goto LAB_00154e8a;
        }
      }
      goto LAB_00154f29;
    }
    if (iVar5 == 0x3b) {
      uVar9 = uVar9 | uVar10 == 2;
      iVar6 = 0x3b;
    }
    else {
      if (iVar5 != 0x3d) {
        if (iVar5 == 0x5b) goto LAB_00154e93;
        goto LAB_00154eb8;
      }
      uVar9 = uVar9 | 4;
      iVar6 = 0x3d;
    }
LAB_00154ee9:
    iVar5 = next_token(s);
    if (iVar5 != 0) goto LAB_00154f29;
  } while (1 < uVar10);
  uVar11 = token->val;
  if (((uVar11 == 0xffffff83) && ((s->token).u.ident.atom == 0x43)) &&
     ((s->token).u.ident.has_escape == 0)) {
    uVar11 = 0xffffffd9;
  }
  if ((local_13c != 0) && (s->last_line_num != (s->token).line_num)) {
    uVar11 = 10;
  }
LAB_00154f8a:
  if (pbits != (int *)0x0) {
    *pbits = uVar9;
  }
  (s->token).line_num = iVar7;
  s->line_num = iVar1;
  s->buf_ptr = puVar4;
  s->got_lf = BVar2;
  iVar7 = next_token(s);
  return -(uint)(iVar7 != 0) | uVar11;
}

Assistant:

static int js_parse_skip_parens_token(JSParseState *s, int *pbits, BOOL no_line_terminator)
{
    char state[256];
    size_t level = 0;
    JSParsePos pos;
    int last_tok, tok = TOK_EOF;
    int c, tok_len, bits = 0;

    /* protect from underflow */
    state[level++] = 0;

    js_parse_get_pos(s, &pos);
    last_tok = 0;
    for (;;) {
        switch(s->token.val) {
        case '(':
        case '[':
        case '{':
            if (level >= sizeof(state))
                goto done;
            state[level++] = s->token.val;
            break;
        case ')':
            if (state[--level] != '(')
                goto done;
            break;
        case ']':
            if (state[--level] != '[')
                goto done;
            break;
        case '}':
            c = state[--level];
            if (c == '`') {
                /* continue the parsing of the template */
                free_token(s, &s->token);
                /* Resume TOK_TEMPLATE parsing (s->token.line_num and
                 * s->token.ptr are OK) */
                s->got_lf = FALSE;
                s->last_line_num = s->token.line_num;
                if (js_parse_template_part(s, s->buf_ptr))
                    goto done;
                goto handle_template;
            } else if (c != '{') {
                goto done;
            }
            break;
        case TOK_TEMPLATE:
        handle_template:
            if (s->token.u.str.sep != '`') {
                /* '${' inside the template : closing '}' and continue
                   parsing the template */
                if (level >= sizeof(state))
                    goto done;
                state[level++] = '`';
            } 
            break;
        case TOK_EOF:
            goto done;
        case ';':
            if (level == 2) {
                bits |= SKIP_HAS_SEMI;
            }
            break;
        case TOK_ELLIPSIS:
            if (level == 2) {
                bits |= SKIP_HAS_ELLIPSIS;
            }
            break;
        case '=':
            bits |= SKIP_HAS_ASSIGNMENT;
            break;
            
        case TOK_DIV_ASSIGN:
            tok_len = 2;
            goto parse_regexp;
        case '/':
            tok_len = 1;
        parse_regexp:
            if (is_regexp_allowed(last_tok)) {
                s->buf_ptr -= tok_len;
                if (js_parse_regexp(s)) {
                    /* XXX: should clear the exception */
                    goto done;
                }
            }
            break;
        }
        /* last_tok is only used to recognize regexps */
        if (s->token.val == TOK_IDENT &&
            (token_is_pseudo_keyword(s, JS_ATOM_of) ||
             token_is_pseudo_keyword(s, JS_ATOM_yield))) {
            last_tok = TOK_OF;
        } else {
            last_tok = s->token.val;
        }
        if (next_token(s)) {
            /* XXX: should clear the exception generated by next_token() */
            break;
        }
        if (level <= 1) {
            tok = s->token.val;
            if (token_is_pseudo_keyword(s, JS_ATOM_of))
                tok = TOK_OF;
            if (no_line_terminator && s->last_line_num != s->token.line_num)
                tok = '\n';
            break;
        }
    }
 done:
    if (pbits) {
        *pbits = bits;
    }
    if (js_parse_seek_token(s, &pos))
        return -1;
    return tok;
}